

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O1

NDSTATUS NdFetchXop(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size)

{
  ushort uVar1;
  uint uVar2;
  NDSTATUS NVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar7 = CONCAT71(in_register_00000011,Offset) & 0xffffffff;
  NVar3 = 0x80000001;
  if (uVar7 + 2 <= Size) {
    if ((Code[uVar7 + 1] & 0x18) == 0) {
      return 0;
    }
    if (uVar7 + 3 <= Size) {
      NVar3 = 0x80000006;
      if ((*(uint *)&Instrux->field_0x5 & 0x323) == 0) {
        *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 8;
        uVar2 = *(uint *)Instrux;
        *(uint *)Instrux = uVar2 & 0xfff0ffff | 0x10000;
        (Instrux->field_73).Rex = *(ND_REX *)(Code + uVar7);
        *(ND_UINT8 *)((long)&Instrux->field_73 + 1) = Code[uVar7 + 1];
        *(ND_UINT8 *)((long)&Instrux->field_73 + 2) = Code[uVar7 + 2];
        uVar1 = *(ushort *)((long)&Instrux->field_73 + 1);
        uVar9 = ~(uint)uVar1;
        uVar8 = uVar9 >> 0xb & 0xf;
        uVar10 = uVar9 >> 6 & 2;
        uVar6 = uVar9 >> 4 & 4;
        uVar11 = uVar8 << 0x10;
        uVar9 = ((uVar1 & 0x1f) << 9 |
                (uVar1 & 0x400) << 4 | (uint)Instrux->Exs & 0xfff00070 | (uint)(uVar1 >> 0xf)) +
                (uVar9 >> 5 & 1) * 8;
        uVar5 = uVar1 >> 1 & 0x180 | uVar10 | uVar6;
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)(uVar5 | uVar9 | uVar11);
        if ((uVar2 & 3) != 2) {
          if ((short)(uVar6 >> 2) != 0 || (short)(uVar10 >> 1) != 0) {
            return 0x80000009;
          }
          if (7 < (ushort)uVar8) {
            return 0x80000009;
          }
          Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)(uVar5 | uVar9 & 0xffff7ff7 | uVar11);
        }
        bVar4 = Instrux->Length + 3;
        Instrux->Length = bVar4;
        NVar3 = 0x80000003;
        if (bVar4 < 0x10) {
          return 0;
        }
      }
    }
  }
  return NVar3;
}

Assistant:

static NDSTATUS
NdFetchXop(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size
    )
{
    // Offset points to the 0x8F XOP prefix.
    // One more byte has to follow, the modrm or the second XOP byte.
    RET_GT((ND_SIZET)Offset + 2, Size, ND_STATUS_BUFFER_TOO_SMALL);

    if (((Code[Offset + 1] & 0x1F) >= 8))
    {
        // XOP found, make sure the third byte is here.
        RET_GT((ND_SIZET)Offset + 3, Size, ND_STATUS_BUFFER_TOO_SMALL);

        // Make sure we don't have any other prefix.
        if (Instrux->HasOpSize || 
            Instrux->HasRepnzXacquireBnd || 
            Instrux->HasRepRepzXrelease || 
            Instrux->HasRex || 
            Instrux->HasRex2)
        {
            return ND_STATUS_XOP_WITH_PREFIX;
        }

        // Fill in XOP info.
        Instrux->HasXop = ND_TRUE;
        Instrux->EncMode = ND_ENCM_XOP;
        Instrux->Xop.Xop[0] = Code[Offset];
        Instrux->Xop.Xop[1] = Code[Offset + 1];
        Instrux->Xop.Xop[2] = Code[Offset + 2];

        Instrux->Exs.w = Instrux->Xop.w;
        Instrux->Exs.r = (ND_UINT32)~Instrux->Xop.r;
        Instrux->Exs.x = (ND_UINT32)~Instrux->Xop.x;
        Instrux->Exs.b = (ND_UINT32)~Instrux->Xop.b;
        Instrux->Exs.l = Instrux->Xop.l;
        Instrux->Exs.v = (ND_UINT32)~Instrux->Xop.v;
        Instrux->Exs.m = Instrux->Xop.m;
        Instrux->Exs.p = Instrux->Xop.p;

        // if we are in non 64 bit mode, we must make sure that none of the extended registers are being addressed.
        if (Instrux->DefCode != ND_CODE_64)
        {
            // Xop.R and Xop.X must be 1 (inverted).
            if ((Instrux->Exs.r | Instrux->Exs.x) == 1)
            {
                return ND_STATUS_INVALID_ENCODING_IN_MODE;
            }

            // Xop.V must be less than 8.
            if ((Instrux->Exs.v & 0x8) == 0x8)
            {
                return ND_STATUS_INVALID_ENCODING_IN_MODE;
            }

            // Xop.B is ignored, so we force it to 0.
            Instrux->Exs.b = 0;
        }

        // Update Instrux length & offset, and make sure we don't exceed 15 bytes.
        Instrux->Length += 3;
        if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
        {
            return ND_STATUS_INSTRUCTION_TOO_LONG;
        }
    }

    return ND_STATUS_SUCCESS;
}